

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::TriangleRasterizer::rasterize
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  int *piVar1;
  FragmentPacket *pFVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  FragmentPacket *pFVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  Vector<long,_4> *pVVar24;
  long lVar25;
  Vector<long,_4> *pVVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  Vector<long,_4> *pVVar37;
  long lVar38;
  float fVar39;
  float fVar40;
  Vector<float,_4> VStack_748;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined1 auStack_728 [16];
  undefined1 auStack_718 [16];
  Vector<long,_4> VStack_708;
  FragmentPacket *pFStack_6e8;
  float *pfStack_6e0;
  ulong uStack_6d8;
  ulong uStack_6d0;
  long lStack_6c8;
  long lStack_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  long alStack_6a8 [4];
  Vector<float,_4> VStack_688;
  long alStack_678 [2];
  int iStack_668;
  int iStack_664;
  int iStack_658;
  int iStack_654;
  long lStack_650;
  tcu atStack_648 [8];
  long lStack_640;
  Vector<long,_4> aVStack_638 [15];
  long alStack_450 [3];
  Vector<long,_4> aVStack_438 [15];
  long alStack_250 [3];
  Vector<long,_4> aVStack_238 [16];
  
  switch(this->m_numSamples) {
  case 1:
    rasterizeSingleSample(this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 2:
    rasterizeMultiSample<2>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_002e977b_caseD_3;
  case 4:
    rasterizeMultiSample<4>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 8:
    rasterizeMultiSample<8>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  default:
    if (this->m_numSamples == 0x10) {
      fVar3 = (this->m_v2).m_data[2];
      fVar39 = (this->m_v0).m_data[2] - fVar3;
      fVar40 = (this->m_v1).m_data[2] - fVar3;
      VStack_708.m_data[3] = (long)(depthValues + 0x30);
      iVar15 = 0;
      VStack_708.m_data[2] = (long)numPacketsRasterized;
      pFStack_6e8 = fragmentPackets;
      pfStack_6e0 = depthValues;
      while( true ) {
        uVar4 = (this->m_curPos).m_data[1];
        uStack_6d0 = (ulong)uVar4;
        if (((this->m_bboxMax).m_data[1] < (int)uVar4) || (maxFragmentPackets <= iVar15)) break;
        uVar5 = (this->m_curPos).m_data[0];
        uStack_6d8 = (ulong)uVar5;
        alStack_6a8[0] = (long)(int)(uVar4 << 8);
        iVar18 = uVar4 + 1;
        alStack_6a8[2] = (long)(iVar18 * 0x100);
        iVar29 = uVar5 + 1;
        iStack_658 = iVar29 * 0x100;
        iStack_654 = -(uint)(iStack_658 < 0);
        alStack_678[0] = CONCAT44(-(uint)((int)(uVar5 << 8) < 0),uVar5 << 8);
        _iStack_668 = CONCAT44(iStack_654,iStack_658);
        iVar13 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
        iVar14 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
        lVar23 = 0;
        alStack_6a8[1] = alStack_6a8[0];
        alStack_6a8[3] = alStack_6a8[2];
        do {
          tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)aVStack_238[0].m_data + lVar23));
          lVar23 = lVar23 + 0x20;
        } while (lVar23 != 0x200);
        lVar23 = 0;
        do {
          tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)aVStack_438[0].m_data + lVar23));
          lVar23 = lVar23 + 0x20;
        } while (lVar23 != 0x200);
        lVar23 = 0;
        do {
          tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)aVStack_638[0].m_data + lVar23));
          lVar10 = VStack_708.m_data[3];
          lVar23 = lVar23 + 0x20;
        } while (lVar23 != 0x200);
        lVar23 = (this->m_edge01).a;
        lVar22 = (this->m_edge01).b;
        lVar31 = (this->m_edge01).c;
        lStack_6c0 = (this->m_edge12).a;
        lVar33 = (this->m_edge12).b;
        lVar6 = (this->m_edge12).c;
        lVar7 = (this->m_edge20).a;
        lVar8 = (this->m_edge20).b;
        lVar9 = (this->m_edge20).c;
        pVVar37 = aVStack_238;
        pVVar26 = aVStack_438;
        pVVar24 = aVStack_638;
        lVar25 = 0;
        while (lVar35 = lVar25, lVar35 != 0x10) {
          lVar25 = (&s_samplePos16)[lVar35 * 2];
          lVar38 = (&DAT_003550e8)[lVar35 * 2];
          for (lVar36 = 0; lVar36 != 4; lVar36 = lVar36 + 1) {
            lVar16 = alStack_678[lVar36] + lVar25;
            lVar20 = alStack_6a8[lVar36] + lVar38;
            pVVar37->m_data[lVar36] = lVar22 * lVar20 + lVar23 * lVar16 + lVar31;
            pVVar26->m_data[lVar36] = lVar33 * lVar20 + lStack_6c0 * lVar16 + lVar6;
            pVVar24->m_data[lVar36] = lVar20 * lVar8 + lVar16 * lVar7 + lVar9;
          }
          pVVar24 = pVVar24 + 1;
          pVVar26 = pVVar26 + 1;
          pVVar37 = pVVar37 + 1;
          lStack_6c8 = lVar35;
          lVar25 = lVar35 + 1;
        }
        uVar21 = (ulong)(this->m_edge01).inclusive;
        lVar22 = -uVar21;
        uVar30 = (ulong)(this->m_edge12).inclusive;
        lVar31 = -uVar30;
        uVar32 = (ulong)(this->m_edge20).inclusive;
        lVar33 = -uVar32;
        lVar23 = 0x18;
        uVar27 = 0;
        for (uVar19 = 0; uVar19 != 0x10; uVar19 = uVar19 + 1) {
          lVar6 = *(long *)((long)alStack_250 + lVar23);
          if ((lVar6 == lVar22 || SBORROW8(lVar6,lVar22) != (long)(lVar6 + uVar21) < 0) ||
             (lVar6 = *(long *)((long)alStack_450 + lVar23),
             lVar6 == lVar31 || SBORROW8(lVar6,lVar31) != (long)(lVar6 + uVar30) < 0)) {
            bVar11 = false;
          }
          else {
            lVar6 = *(long *)((long)&lStack_650 + lVar23);
            bVar11 = lVar6 != lVar33 && SBORROW8(lVar6,lVar33) == (long)(lVar6 + uVar32) < 0;
          }
          uVar28 = uVar27 & ~(1L << (uVar19 & 0x3f));
          if (bVar11) {
            uVar28 = uVar27 | 1L << (uVar19 & 0x3f);
          }
          if (((iVar29 == iVar13) ||
              (lVar6 = *(long *)((long)alStack_250 + lVar23 + 8),
              lVar6 == lVar22 || SBORROW8(lVar6,lVar22) != (long)(lVar6 + uVar21) < 0)) ||
             (lVar6 = *(long *)((long)alStack_450 + lVar23 + 8),
             lVar6 == lVar31 || SBORROW8(lVar6,lVar31) != (long)(lVar6 + uVar30) < 0)) {
            bVar11 = false;
          }
          else {
            lVar6 = *(long *)(atStack_648 + lVar23);
            bVar11 = lVar6 != lVar33 && SBORROW8(lVar6,lVar33) == (long)(lVar6 + uVar32) < 0;
          }
          bVar17 = (byte)uVar19;
          uVar34 = 0x100000000 << (bVar17 & 0x3f);
          uVar27 = ~uVar34 & uVar28;
          if (bVar11) {
            uVar27 = uVar28 | uVar34;
          }
          if (((iVar18 == iVar14) ||
              (lVar6 = *(long *)((long)alStack_250 + lVar23 + 0x10),
              lVar6 == lVar22 || SBORROW8(lVar6,lVar22) != (long)(lVar6 + uVar21) < 0)) ||
             (lVar6 = *(long *)((long)alStack_450 + lVar23 + 0x10),
             lVar6 == lVar31 || SBORROW8(lVar6,lVar31) != (long)(lVar6 + uVar30) < 0)) {
            bVar11 = false;
          }
          else {
            lVar6 = *(long *)((long)&lStack_640 + lVar23);
            bVar11 = lVar6 != lVar33 && SBORROW8(lVar6,lVar33) == (long)(lVar6 + uVar32) < 0;
          }
          uVar34 = 0x10000L << (bVar17 & 0x3f);
          uVar28 = ~uVar34 & uVar27;
          if (bVar11) {
            uVar28 = uVar27 | uVar34;
          }
          if (((iVar18 == iVar14 || iVar29 == iVar13) ||
              (lVar6 = *(long *)((long)aVStack_238[0].m_data + lVar23),
              lVar6 == lVar22 || SBORROW8(lVar6,lVar22) != (long)(lVar6 + uVar21) < 0)) ||
             (lVar6 = *(long *)((long)aVStack_438[0].m_data + lVar23),
             lVar6 == lVar31 || SBORROW8(lVar6,lVar31) != (long)(lVar6 + uVar30) < 0)) {
            bVar11 = false;
          }
          else {
            lVar6 = *(long *)((long)aVStack_638[0].m_data + lVar23);
            bVar11 = lVar6 != lVar33 && SBORROW8(lVar6,lVar33) == (long)(lVar6 + uVar32) < 0;
          }
          uVar34 = 0x1000000000000 << (bVar17 & 0x3f);
          uVar27 = ~uVar34 & uVar28;
          if (bVar11) {
            uVar27 = uVar28 | uVar34;
          }
          lVar23 = lVar23 + 0x20;
        }
        iVar13 = (this->m_curPos).m_data[0] + 2;
        (this->m_curPos).m_data[0] = iVar13;
        if ((this->m_bboxMax).m_data[0] < iVar13) {
          piVar1 = (this->m_curPos).m_data + 1;
          *piVar1 = *piVar1 + 2;
          (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
        }
        if (uVar27 != 0) {
          if (pfStack_6e0 != (float *)0x0) {
            iVar13 = iVar15 << 6;
            for (lVar23 = -0x40; lVar23 != 0; lVar23 = lVar23 + 4) {
              tcu::Vector<long,_4>::cast<float>(&VStack_708);
              tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)auStack_718);
              tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)auStack_728);
              tcu::operator+((tcu *)&VStack_748,(Vector<float,_4> *)&VStack_708,
                             (Vector<float,_4> *)auStack_718);
              tcu::operator+((tcu *)&VStack_688,&VStack_748,(Vector<float,_4> *)auStack_728);
              tcu::operator/((tcu *)&VStack_748,(Vector<float,_4> *)auStack_718,&VStack_688);
              tcu::operator/((tcu *)&fStack_738,(Vector<float,_4> *)auStack_728,&VStack_688);
              *(float *)(lVar10 + lVar23 + (long)iVar13 * 4 + -0x80) =
                   VStack_748.m_data[0] * fVar39 + fStack_738 * fVar40 + fVar3;
              *(float *)(lVar10 + lVar23 + (long)iVar13 * 4 + -0x40) =
                   VStack_748.m_data[1] * fVar39 + fStack_734 * fVar40 + fVar3;
              *(float *)(lVar10 + lVar23 + (long)iVar13 * 4) =
                   VStack_748.m_data[2] * fVar39 + fStack_730 * fVar40 + fVar3;
              *(float *)(lVar10 + lVar23 + (long)iVar13 * 4 + 0x40) =
                   VStack_748.m_data[3] * fVar39 + fStack_72c * fVar40 + fVar3;
            }
          }
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&VStack_708);
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_718);
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_728);
          lVar23 = (this->m_edge01).a;
          lVar10 = (this->m_edge01).b;
          lVar22 = (this->m_edge01).c;
          lVar31 = (this->m_edge12).a;
          lVar33 = (this->m_edge12).b;
          lVar6 = (this->m_edge12).c;
          lVar7 = (this->m_edge20).a;
          lVar8 = (this->m_edge20).b;
          lVar9 = (this->m_edge20).c;
          for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 4) {
            lVar38 = *(long *)((long)alStack_678 + lVar25 * 2) + 0x80;
            lVar35 = *(long *)((long)alStack_6a8 + lVar25 * 2) + 0x80;
            *(float *)((long)VStack_708.m_data + lVar25) =
                 (float)(lVar10 * lVar35 + lVar23 * lVar38 + lVar22);
            *(float *)(auStack_718 + lVar25) = (float)(lVar33 * lVar35 + lVar31 * lVar38 + lVar6);
            *(float *)(auStack_728 + lVar25) = (float)(lVar35 * lVar8 + lVar38 * lVar7 + lVar9);
          }
          tcu::operator*((tcu *)&VStack_688,(this->m_v0).m_data[3],(Vector<float,_4> *)auStack_718);
          tcu::operator*((tcu *)&VStack_748,(this->m_v1).m_data[3],(Vector<float,_4> *)auStack_728);
          tcu::operator*((tcu *)&fStack_738,(this->m_v2).m_data[3],(Vector<float,_4> *)&VStack_708);
          tcu::operator+((tcu *)&uStack_6b8,&VStack_688,&VStack_748);
          tcu::operator+(atStack_648,(Vector<float,_4> *)&uStack_6b8,(Vector<float,_4> *)&fStack_738
                        );
          pFVar12 = pFStack_6e8;
          pFVar2 = pFStack_6e8 + iVar15;
          *(ulong *)(pFVar2->position).m_data = (uStack_6d0 << 0x20) + uStack_6d8;
          pFVar2->coverage = uVar27;
          tcu::operator/((tcu *)&uStack_6b8,&VStack_688,(Vector<float,_4> *)atStack_648);
          *(undefined8 *)pFVar2->barycentric[0].m_data = uStack_6b8;
          *(undefined8 *)(pFVar2->barycentric[0].m_data + 2) = uStack_6b0;
          tcu::operator/((tcu *)&uStack_6b8,&VStack_748,(Vector<float,_4> *)atStack_648);
          *(undefined8 *)pFVar12[iVar15].barycentric[1].m_data = uStack_6b8;
          *(undefined8 *)(pFVar12[iVar15].barycentric[1].m_data + 2) = uStack_6b0;
          tcu::operator-((tcu *)&iStack_658,1.0,pFVar2->barycentric);
          tcu::operator-((tcu *)&uStack_6b8,(Vector<float,_4> *)&iStack_658,
                         pFVar12[iVar15].barycentric + 1);
          *(undefined8 *)pFVar12[iVar15].barycentric[2].m_data = uStack_6b8;
          *(undefined8 *)(pFVar12[iVar15].barycentric[2].m_data + 2) = uStack_6b0;
          iVar15 = iVar15 + 1;
        }
      }
      *(int *)VStack_708.m_data[2] = iVar15;
      return;
    }
switchD_002e977b_caseD_3:
    return;
  }
}

Assistant:

void TriangleRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	switch (m_numSamples)
	{
		case 1:		rasterizeSingleSample		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 2:		rasterizeMultiSample<2>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 4:		rasterizeMultiSample<4>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 8:		rasterizeMultiSample<8>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 16:	rasterizeMultiSample<16>	(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}